

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O0

void __thiscall duckdb::CatalogEntryMap::DropEntry(CatalogEntryMap *this,CatalogEntry *entry)

{
  bool bVar1;
  undefined8 uVar2;
  iterator iVar3;
  CatalogEntry *child_p;
  long in_RSI;
  CatalogEntry *parent;
  iterator it;
  unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> child;
  optional_ptr<duckdb::CatalogEntry,_true> chain;
  string *name;
  pointer in_stack_ffffffffffffff08;
  CatalogEntry *in_stack_ffffffffffffff10;
  iterator in_stack_ffffffffffffff18;
  CatalogEntry *in_stack_ffffffffffffff20;
  CatalogEntry *in_stack_ffffffffffffff28;
  unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> local_b0;
  CatalogEntry *local_a8;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar4;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  optional_ptr<duckdb::CatalogEntry,_true> local_20;
  string *local_18;
  
  local_18 = (string *)(in_RSI + 0x20);
  local_20 = GetEntry(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  bVar1 = optional_ptr<duckdb::CatalogEntry,_true>::operator_bool(&local_20);
  if (bVar1) {
    CatalogEntry::TakeChild(in_stack_ffffffffffffff28);
    bVar1 = CatalogEntry::HasParent(in_stack_ffffffffffffff10);
    if (bVar1) {
      child_p = CatalogEntry::Parent((CatalogEntry *)0x2a926c6);
      local_a8 = child_p;
      unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::unique_ptr
                (&local_b0,
                 (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                  *)child_p);
      CatalogEntry::SetChild
                (in_stack_ffffffffffffff20,
                 (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                  *)child_p);
      unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::~unique_ptr
                ((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                  *)0x2a9270e);
    }
    else {
      iVar3 = ::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
              ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
                      *)in_stack_ffffffffffffff08,(key_type *)0x2a9261c);
      ::std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>
                    *)0x2a92637);
      unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::reset
                ((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                  *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      bVar1 = ::std::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>::
              operator_bool((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>
                             *)0x2a92651);
      if (bVar1) {
        ::std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>
                      *)0x2a92661);
        unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::operator=
                  ((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                    *)in_stack_ffffffffffffff10,
                   (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                    *)in_stack_ffffffffffffff08);
      }
      else {
        local_98 = iVar3._M_node;
        local_a0 = (_Base_ptr)
                   ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
                   ::erase((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
                            *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
      }
    }
    unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::~unique_ptr
              ((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
               0x2a9273a);
    return;
  }
  uVar4 = 1;
  uVar2 = __cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_40,"Attempting to drop entry with name \"%s\" but no chain with that name exists"
             ,&local_41);
  ::std::__cxx11::string::string(local_78,local_18);
  InternalException::
  InternalException<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ((InternalException *)CONCAT17(uVar4,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  __cxa_throw(uVar2,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

void CatalogEntryMap::DropEntry(CatalogEntry &entry) {
	auto &name = entry.name;
	auto chain = GetEntry(name);
	if (!chain) {
		throw InternalException("Attempting to drop entry with name \"%s\" but no chain with that name exists", name);
	}
	auto child = entry.TakeChild();
	if (!entry.HasParent()) {
		// This is the top of the chain
		D_ASSERT(chain.get() == &entry);
		auto it = entries.find(name);
		D_ASSERT(it != entries.end());

		// Remove the entry
		it->second.reset();
		if (child) {
			// Replace it with its child
			it->second = std::move(child);
		} else {
			entries.erase(it);
		}
	} else {
		// Just replace the entry with its child
		auto &parent = entry.Parent();
		parent.SetChild(std::move(child));
	}
}